

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

int secp256k1_ge_x_on_curve_var(secp256k1_fe *x)

{
  int iVar1;
  secp256k1_fe c;
  secp256k1_fe *in_stack_00000048;
  secp256k1_fe *in_stack_ffffffffffffffc8;
  secp256k1_fe *in_stack_ffffffffffffffd0;
  
  secp256k1_fe_impl_sqr(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  secp256k1_fe_impl_mul
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(secp256k1_fe *)0x12d6ea);
  secp256k1_fe_impl_add_int((secp256k1_fe *)&stack0xffffffffffffffd0,7);
  iVar1 = secp256k1_fe_impl_is_square_var(in_stack_00000048);
  return iVar1;
}

Assistant:

static int secp256k1_ge_x_on_curve_var(const secp256k1_fe *x) {
    secp256k1_fe c;
    secp256k1_fe_sqr(&c, x);
    secp256k1_fe_mul(&c, &c, x);
    secp256k1_fe_add_int(&c, SECP256K1_B);
    return secp256k1_fe_is_square_var(&c);
}